

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clogger.h
# Opt level: O0

void __thiscall CLogger::Warn<char_const&>(CLogger *this,string_view fmt,char *args)

{
  basic_string_view<char,_std::char_traits<char>_> s;
  element_type *this_00;
  char *in_stack_ffffffffffffff88;
  logger *in_stack_ffffffffffffff90;
  basic_string_view<char> in_stack_ffffffffffffff98;
  undefined1 local_38 [32];
  undefined1 *local_18;
  undefined1 *local_10;
  undefined1 *local_8;
  
  spdlog::get(in_stack_ffffffffffffff88);
  this_00 = std::__shared_ptr_access<spdlog::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<spdlog::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x5b3ac6);
  local_10 = &stack0xffffffffffffff98;
  local_18 = local_38;
  s._M_str = (char *)in_stack_ffffffffffffff90;
  s._M_len = (size_t)in_stack_ffffffffffffff88;
  ::fmt::v9::basic_string_view<char>::
  basic_string_view<std::basic_string_view<char,_std::char_traits<char>_>,_0>
            ((basic_string_view<char> *)this_00,s);
  local_8 = local_18;
  spdlog::logger::warn<char_const&>
            (in_stack_ffffffffffffff90,(format_string_t<const_char_&>)in_stack_ffffffffffffff98,
             in_stack_ffffffffffffff88);
  std::shared_ptr<spdlog::logger>::~shared_ptr((shared_ptr<spdlog::logger> *)0x5b3b3b);
  return;
}

Assistant:

void Warn(std::string_view fmt, Args &&...args)
	{
		spdlog::get("rs")->warn(fmt, std::forward<Args>(args)...);
	}